

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cpp
# Opt level: O3

bool wallet::LoadWallets(WalletContext *context)

{
  Chain *pCVar1;
  string *__source;
  bool bVar2;
  duration this;
  long in_FS_OFFSET;
  char cVar3;
  pair<std::_Rb_tree_iterator<fs::path>,_bool> pVar4;
  shared_ptr<wallet::CWallet> pwallet;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  DatabaseStatus status;
  bilingual_str error;
  DatabaseOptions options;
  set<fs::path,_std::less<fs::path>,_std::allocator<fs::path>_> wallet_paths;
  long *local_210;
  undefined1 local_208 [24];
  long *local_1f0;
  vector<bilingual_str,_std::allocator<bilingual_str>_> local_1e8;
  DatabaseStatus local_1cc;
  vector<UniValue,_std::allocator<UniValue>_> local_1c8 [2];
  __node_base *local_190;
  size_type local_188;
  __node_base local_180 [2];
  __node_base_ptr *local_170 [2];
  __node_base_ptr local_160 [2];
  Chain *local_150 [2];
  size_type local_140 [2];
  string local_130 [16];
  long local_120 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  bilingual_str local_f0;
  undefined1 local_b0 [24];
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
  local_88;
  ushort local_78;
  bool local_76;
  size_t local_70;
  _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = context->chain;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._0_8_ = local_b0 + 0x10;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"wallet","");
  (**(code **)(*(long *)pCVar1 + 0x178))(local_1c8,pCVar1,local_b0);
  if ((_Base_ptr)local_b0._0_8_ != (_Base_ptr)(local_b0 + 0x10)) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (local_1c8[0].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1c8[0].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this.__r = (rep)local_1c8[0].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_start;
    do {
      if (((UniValue *)this.__r)->typ != VSTR) {
        local_b0._0_8_ = local_b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b0,
                   "Invalid value detected for \'-wallet\' or \'-nowallet\'. \'-wallet\' requires a string value, while \'-nowallet\' accepts only \'1\' to disable all wallets"
                   ,"");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_98._8_8_ = local_88._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_98 + 8),
                     "Invalid value detected for \'-wallet\' or \'-nowallet\'. \'-wallet\' requires a string value, while \'-nowallet\' accepts only \'1\' to disable all wallets"
                     ,"");
        }
        else {
          local_f0.original._M_dataplus._M_p =
               "Invalid value detected for \'-wallet\' or \'-nowallet\'. \'-wallet\' requires a string value, while \'-nowallet\' accepts only \'1\' to disable all wallets"
          ;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_98 + 8),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_f0);
        }
        (**(code **)(*(long *)pCVar1 + 0x138))(pCVar1,local_b0);
        if ((char *)local_98._8_8_ != local_88._M_local_buf + 8) {
          operator_delete((void *)local_98._8_8_,local_88._8_8_ + 1);
        }
        if ((_Base_ptr)local_b0._0_8_ != (_Base_ptr)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        }
LAB_001e1537:
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(local_1c8);
        bVar2 = false;
        goto LAB_001e1543;
      }
      __source = UniValue::get_str_abi_cxx11_((UniValue *)this.__r);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&local_f0,__source,auto_format);
      std::filesystem::__cxx11::path::path((path *)local_b0,(path *)&local_f0);
      std::filesystem::__cxx11::path::~path((path *)&local_f0);
      pVar4 = std::
              _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
              ::_M_insert_unique<fs::path>(&local_68,(path *)local_b0);
      std::filesystem::__cxx11::path::~path((path *)local_b0);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_b0._0_8_ = local_b0._0_8_ & 0xffffffffffff0000;
        local_b0[8] = false;
        local_b0._16_8_ = 0;
        local_98._0_8_ = &local_88;
        local_98._8_8_ = (char *)0x0;
        local_88._M_local_buf[0] = '\0';
        local_78 = 1;
        local_76 = false;
        local_70 = 100;
        ReadDatabaseArgs(context->args,(DatabaseOptions *)local_b0);
        local_b0[0] = 1;
        local_78 = local_78 & 0xff00;
        local_f0.original._M_dataplus._M_p = (pointer)&local_f0.original.field_2;
        local_f0.original._M_string_length = 0;
        local_f0.original.field_2._M_local_buf[0] = '\0';
        local_f0.translated._M_dataplus._M_p = (pointer)&local_f0.translated.field_2;
        local_f0.translated._M_string_length = 0;
        local_f0.translated.field_2._M_local_buf[0] = '\0';
        local_1e8.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1e8.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1e8.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        MakeWalletDatabase((wallet *)&local_1f0,__source,(DatabaseOptions *)local_b0,&local_1cc,
                           &local_f0);
        if ((local_1f0 != (long *)0x0) || (cVar3 = '\x03', local_1cc != FAILED_NOT_FOUND)) {
          local_130._0_8_ = local_120;
          std::__cxx11::string::_M_construct<char_const*>
                    (local_130,anon_var_dwarf_239881,anon_var_dwarf_239881 + 0x11);
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,anon_var_dwarf_239881,anon_var_dwarf_239881 + 0x11);
          }
          else {
            local_170[0] = (__node_base_ptr *)anon_var_dwarf_239881;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_110,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_170);
          }
          (**(code **)(*(long *)pCVar1 + 0x128))(pCVar1,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((long *)local_130._0_8_ != local_120) {
            operator_delete((void *)local_130._0_8_,local_120[0] + 1);
          }
          if (local_1f0 == (long *)0x0) {
            local_208._0_8_ = (_func_int **)0x0;
            local_208._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            local_210 = local_1f0;
            local_1f0 = (long *)0x0;
            CWallet::Create((CWallet *)local_208,context,__source,
                            (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                             )&local_210,local_b0._16_8_,&local_f0,&local_1e8);
            if (local_210 != (long *)0x0) {
              (**(code **)(*local_210 + 8))();
            }
            local_210 = (long *)0x0;
          }
          if (local_1e8.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_1e8.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_190 = local_180;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"\n","");
            local_170[0] = local_160;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_170,local_190,(long)&local_190->_M_nxt + local_188);
            local_150[0] = (Chain *)local_140;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_150,local_190,(long)&local_190->_M_nxt + local_188);
            util::
            Join<std::vector<bilingual_str,std::allocator<bilingual_str>>,bilingual_str,util::Join<std::vector<bilingual_str,std::allocator<bilingual_str>>,bilingual_str>(std::vector<bilingual_str,std::allocator<bilingual_str>>const&,bilingual_str_const&)::_lambda(auto:1_const&)_1_>
                      (local_130,(util *)&local_1e8,local_170);
            (**(code **)(*(long *)pCVar1 + 0x130))(pCVar1,local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            if ((long *)local_130._0_8_ != local_120) {
              operator_delete((void *)local_130._0_8_,local_120[0] + 1);
            }
            if (local_150[0] != (Chain *)local_140) {
              operator_delete(local_150[0],local_140[0] + 1);
            }
            if (local_170[0] != local_160) {
              operator_delete(local_170[0],(ulong)((long)&local_160[0]->_M_nxt + 1));
            }
            if (local_190 != local_180) {
              operator_delete(local_190,(ulong)((long)&(local_180[0]._M_nxt)->_M_nxt + 1));
            }
          }
          cVar3 = (_func_int **)local_208._0_8_ == (_func_int **)0x0;
          if ((bool)cVar3) {
            (**(code **)(*(long *)pCVar1 + 0x138))(pCVar1,&local_f0);
          }
          else {
            NotifyWalletLoaded(context,(shared_ptr<wallet::CWallet> *)local_208);
            AddWallet(context,(shared_ptr<wallet::CWallet> *)local_208);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
          }
          if (local_1f0 != (long *)0x0) {
            (**(code **)(*local_1f0 + 8))();
          }
        }
        std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.translated._M_dataplus._M_p != &local_f0.translated.field_2) {
          operator_delete(local_f0.translated._M_dataplus._M_p,
                          CONCAT71(local_f0.translated.field_2._M_allocated_capacity._1_7_,
                                   local_f0.translated.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.original._M_dataplus._M_p != &local_f0.original.field_2) {
          operator_delete(local_f0.original._M_dataplus._M_p,
                          CONCAT71(local_f0.original.field_2._M_allocated_capacity._1_7_,
                                   local_f0.original.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
             *)local_98._0_8_ != &local_88) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::
          _M_destroy((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)local_98
                     ,CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]));
        }
        if ((cVar3 != '\x03') && (cVar3 != '\0')) goto LAB_001e1537;
      }
      this.__r = this.__r + 0x58;
    } while ((pointer)this.__r !=
             local_1c8[0].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(local_1c8);
  bVar2 = true;
LAB_001e1543:
  std::
  _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool LoadWallets(WalletContext& context)
{
    interfaces::Chain& chain = *context.chain;
    try {
        std::set<fs::path> wallet_paths;
        for (const auto& wallet : chain.getSettingsList("wallet")) {
            if (!wallet.isStr()) {
                chain.initError(_("Invalid value detected for '-wallet' or '-nowallet'. "
                                  "'-wallet' requires a string value, while '-nowallet' accepts only '1' to disable all wallets"));
                return false;
            }
            const auto& name = wallet.get_str();
            if (!wallet_paths.insert(fs::PathFromString(name)).second) {
                continue;
            }
            DatabaseOptions options;
            DatabaseStatus status;
            ReadDatabaseArgs(*context.args, options);
            options.require_existing = true;
            options.verify = false; // No need to verify, assuming verified earlier in VerifyWallets()
            bilingual_str error;
            std::vector<bilingual_str> warnings;
            std::unique_ptr<WalletDatabase> database = MakeWalletDatabase(name, options, status, error);
            if (!database && status == DatabaseStatus::FAILED_NOT_FOUND) {
                continue;
            }
            chain.initMessage(_("Loading wallet…").translated);
            std::shared_ptr<CWallet> pwallet = database ? CWallet::Create(context, name, std::move(database), options.create_flags, error, warnings) : nullptr;
            if (!warnings.empty()) chain.initWarning(Join(warnings, Untranslated("\n")));
            if (!pwallet) {
                chain.initError(error);
                return false;
            }

            NotifyWalletLoaded(context, pwallet);
            AddWallet(context, pwallet);
        }
        return true;
    } catch (const std::runtime_error& e) {
        chain.initError(Untranslated(e.what()));
        return false;
    }
}